

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

int __thiscall
ON_Material::MaterialChannelIndexFromId(ON_Material *this,ON_UUID material_channel_id)

{
  ON_UuidIndex *pOVar1;
  bool bVar2;
  ulong uVar3;
  ON_UuidIndex *b;
  ON_UUID_struct local_30;
  
  local_30.Data4 = material_channel_id.Data4;
  local_30._0_8_ = material_channel_id._0_8_;
  bVar2 = ::operator==(&ON_nil_uuid,&local_30);
  if ((!bVar2) && (uVar3 = (ulong)(uint)(this->m_material_channel).m_count, uVar3 != 0)) {
    b = (this->m_material_channel).m_a;
    pOVar1 = b + uVar3;
    do {
      bVar2 = ::operator==(&local_30,&b->m_id);
      if (bVar2) {
        return b->m_i;
      }
      b = b + 1;
    } while (b < pOVar1);
  }
  return 0;
}

Assistant:

int ON_Material::MaterialChannelIndexFromId(
  ON_UUID material_channel_id
) const
{
  for (;;)
  {
    if (ON_nil_uuid == material_channel_id)
      break;
    const unsigned count = m_material_channel.UnsignedCount();
    if (0 == count)
      break;
    const ON_UuidIndex* a = m_material_channel.Array();
    for ( const ON_UuidIndex* a1 = a + count; a < a1; ++a)
    {
      if (material_channel_id == a->m_id)
        return a->m_i;
    }
    break;
  }

  return 0;
}